

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_0::RelativeChangeCase::calibrate(RelativeChangeCase *this)

{
  TestLog *log;
  code *pcVar1;
  deUint32 dVar2;
  int iVar3;
  State SVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  deUint64 dVar7;
  undefined4 extraout_var_00;
  deUint64 dVar8;
  long lVar9;
  TheilSenCalibrator calibrator;
  deUint8 buffer [4];
  RenderData geom;
  ObjectData local_240;
  CalibratorParameters local_154;
  RenderData local_138;
  long lVar6;
  
  iVar3 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  log = ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_240,this);
  RenderData::RenderData(&local_138,&local_240,(this->super_BaseCase).m_renderCtx,log);
  if (local_240.geometry.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.geometry.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_240.geometry.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.geometry.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240.shader.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_240.shader.attribLocationBindings);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_240.shader.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  local_154.numInitialCalls = 0x14;
  local_154.maxCalibrateIterationFrames = 10;
  local_154.calibrateIterationShortcutThreshold = 20000.0;
  local_154.maxCalibrateIterations = 0x14;
  local_154.targetFrameTimeUs = 33000.0;
  local_154.frameTimeCapUs = 40000.0;
  local_154.targetMeasureDurationUs = 1e+06;
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator((TheilSenCalibrator *)&local_240,&local_154);
  while( true ) {
    while( true ) {
      SVar4 = deqp::gls::TheilSenCalibrator::getState((TheilSenCalibrator *)&local_240);
      dVar2 = local_138.m_program.m_program.m_program;
      if (SVar4 != STATE_RECOMPUTE_PARAMS) break;
      deqp::gls::TheilSenCalibrator::recomputeParameters((TheilSenCalibrator *)&local_240);
    }
    if (SVar4 != STATE_MEASURE) break;
    (**(code **)(lVar6 + 0x1680))(local_138.m_program.m_program.m_program);
    pcVar1 = *(code **)(lVar6 + 0x14f0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar2,"u_iterations");
    (*pcVar1)(uVar5,(int)local_240.shader.sources[1].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar7 = deGetMicroseconds();
    (**(code **)(lVar6 + 0x188))(0x4500);
    (**(code **)(lVar6 + 0x4e8))(0xb71);
    iVar3 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
    lVar9 = CONCAT44(extraout_var_00,iVar3);
    (**(code **)(lVar9 + 0x1680))(local_138.m_program.m_program.m_program);
    (**(code **)(lVar9 + 0xd8))(local_138.m_vao.super_ObjectWrapper.m_object);
    (**(code **)(lVar9 + 0x538))(4,0,local_138.m_numVertices);
    (**(code **)(lVar9 + 0xd8))(0);
    (**(code **)(lVar6 + 0x1220))(0,0,1,1,0x1908,0x1401,&local_154);
    dVar8 = deGetMicroseconds();
    deqp::gls::TheilSenCalibrator::recordIteration((TheilSenCalibrator *)&local_240,dVar8 - dVar7);
  }
  if (SVar4 == STATE_FINISHED) {
    deqp::gls::logCalibrationInfo
              (((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
               (TheilSenCalibrator *)&local_240);
  }
  else {
    local_240.shader.sources[1].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  deqp::gls::TheilSenCalibrator::~TheilSenCalibrator((TheilSenCalibrator *)&local_240);
  glu::ObjectWrapper::~ObjectWrapper(&local_138.m_vbo.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_138.m_vao.super_ObjectWrapper);
  glu::ShaderProgram::~ShaderProgram(&local_138.m_program);
  return (int)local_240.shader.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

int RelativeChangeCase::calibrate (void) const
{
	using namespace gls;

	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	const RenderData		geom	(genOccludedGeometry(), m_renderCtx, log);

	TheilSenCalibrator calibrator(CalibratorParameters( 20, // Initial workload
														10, // Max iteration frames
														20.0f, // Iteration shortcut threshold ms
														20, // Max iterations
														33.0f, // Target frame time
														40.0f, // Frame time cap
														1000.0f // Target measurement duration
														));

	while (true)
	{
		switch(calibrator.getState())
		{
			case TheilSenCalibrator::STATE_FINISHED:
				logCalibrationInfo(m_testCtx.getLog(), calibrator);
				return calibrator.getCallCount();

			case TheilSenCalibrator::STATE_MEASURE:
			{
				deUint8			buffer[4];
				const GLuint	program	= geom.m_program.getProgram();

				gl.useProgram(program);
				gl.uniform1i(gl.getUniformLocation(program, "u_iterations"), calibrator.getCallCount());

				const deInt64 prev = deGetMicroseconds();

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				gl.disable(GL_DEPTH_TEST);

				render(geom);

				gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				const deInt64 now = deGetMicroseconds();

				calibrator.recordIteration(now - prev);
				break;
			}

			case TheilSenCalibrator::STATE_RECOMPUTE_PARAMS:
				calibrator.recomputeParameters();
				break;
			default:
				DE_ASSERT(false);
				return 1;
		}
	}
}